

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
::find_position<HashObject<8,8>*>
          (dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
           *this,HashObject<8,_8> **key)

{
  HashObject<8,_8> *pHVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  uVar2 = (ulong)*key >> 3;
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  uVar5 = 0xffffffffffffffff;
  while( true ) {
    uVar2 = uVar2 & *(long *)(this + 0x40) - 1U;
    pHVar1 = *(HashObject<8,_8> **)(*(long *)(this + 0x50) + uVar2 * 0x10);
    if (*(HashObject<8,_8> **)(this + 0x28) == pHVar1) break;
    if ((*(long *)(this + 0x30) == 0) || (*(HashObject<8,_8> **)(this + 0x20) != pHVar1)) {
      if (*key == pHVar1) goto LAB_00142105;
    }
    else if (uVar5 == 0xffffffffffffffff) {
      uVar5 = uVar2;
    }
    uVar2 = uVar2 + lVar4 + 1;
    lVar4 = lVar4 + 1;
  }
  uVar3 = uVar2;
  if (uVar5 != 0xffffffffffffffff) {
    uVar3 = uVar5;
  }
  uVar2 = 0xffffffffffffffff;
LAB_00142105:
  pVar6.second = uVar3;
  pVar6.first = uVar2;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }